

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O0

char * uo_json_encode_utf8(char *dst,char *src,size_t src_len)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  byte *pbStack_38;
  uchar c;
  uchar *p;
  uchar *u8;
  size_t src_len_local;
  char *src_local;
  char *dst_local;
  
  if (src == (char *)0x0) {
    dst_local = uo_json_encode_null(dst);
  }
  else {
    *dst = '\"';
    pbStack_38 = (byte *)(dst + 1);
    p = (uchar *)src;
    u8 = (uchar *)src_len;
    while (u8 != (uchar *)0x0) {
      bVar1 = *p;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)bVar1] & 2) == 0) {
        if ((bVar1 == 0x22) || (bVar1 == 0x5c)) {
          *pbStack_38 = 0x5c;
          pbStack_38 = pbStack_38 + 1;
        }
        *pbStack_38 = bVar1;
        pbStack_38 = pbStack_38 + 1;
        p = p + 1;
        u8 = u8 + -1;
      }
      else {
        iVar2 = sprintf((char *)pbStack_38,"\\u%04X",(ulong)bVar1);
        pbStack_38 = pbStack_38 + iVar2;
        p = p + 1;
        u8 = u8 + -1;
      }
    }
    dst_local = (char *)(pbStack_38 + 1);
    *pbStack_38 = 0x22;
  }
  return dst_local;
}

Assistant:

char *uo_json_encode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    if (!src)
        return uo_json_encode_null(dst);

    const unsigned char *u8 = (unsigned char *)src;
    unsigned char *p = (unsigned char *)dst;
    *p++ = '"';

    while (src_len--)
    {
        unsigned char c = *u8++;

        if (iscntrl(c))
        {
            p += sprintf(p, "\\u%04X", c);
            continue;
        }

        if (c == '"' || c == '\\')
            *p++ = '\\';

        *p++ = c;
    }

    *p++ = '"';
    return p;
}